

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O0

bool __thiscall QMYSQLResult::fetch(QMYSQLResult *this,int i)

{
  byte bVar1;
  int iVar2;
  QMYSQLResultPrivate *pQVar3;
  long lVar4;
  ulong uVar5;
  MYSQL_ROW ppcVar6;
  int in_ESI;
  MYSQL_STMT *in_RDI;
  long in_FS_OFFSET;
  int nRC;
  int x;
  QMYSQLResultPrivate *d;
  byte local_5d;
  int local_4c;
  MYSQL_STMT *stmt;
  ErrorType in_stack_ffffffffffffffd4;
  bool bVar7;
  QString *in_stack_ffffffffffffffd8;
  QSqlError local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  stmt = in_RDI;
  pQVar3 = d_func((QMYSQLResult *)0x10aa3e);
  lVar4 = QSqlResult::driver();
  if (lVar4 == 0) {
    bVar7 = false;
  }
  else {
    uVar5 = QSqlResult::isForwardOnly();
    if ((uVar5 & 1) == 0) {
      iVar2 = QSqlResult::at();
      if (iVar2 == in_ESI) {
        bVar7 = true;
      }
      else {
        if ((pQVar3->preparedQuery & 1U) == 0) {
          mysql_data_seek(pQVar3->result,(long)in_ESI);
          ppcVar6 = (MYSQL_ROW)mysql_fetch_row(pQVar3->result);
          pQVar3->row = ppcVar6;
          if (pQVar3->row == (MYSQL_ROW)0x0) {
            bVar7 = false;
            goto LAB_0010ac32;
          }
        }
        else {
          mysql_stmt_data_seek(pQVar3->stmt,(long)in_ESI);
          iVar2 = mysql_stmt_fetch(pQVar3->stmt);
          if (iVar2 != 0) {
            if ((iVar2 == 1) || (iVar2 == 0x65)) {
              QCoreApplication::translate
                        (&stack0xffffffffffffffd8,"QMYSQLResult","Unable to fetch data",0);
              qMakeStmtError(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,stmt);
              (**(code **)(in_RDI->mem_root + 0x28))(in_RDI,local_10);
              QSqlError::~QSqlError(local_10);
              QString::~QString((QString *)0x10abc7);
            }
            bVar7 = false;
            goto LAB_0010ac32;
          }
        }
        (**(code **)(in_RDI->mem_root + 0x18))(in_RDI,in_ESI);
        bVar7 = true;
      }
    }
    else {
      iVar2 = QSqlResult::at();
      if (iVar2 < in_ESI) {
        local_4c = QSqlResult::at();
        local_4c = in_ESI - local_4c;
        do {
          local_4c = local_4c + -1;
          local_5d = 0;
          if (local_4c != 0) {
            local_5d = (**(code **)(in_RDI->mem_root + 0x90))();
          }
        } while ((local_5d & 1) != 0);
        bVar1 = (**(code **)(in_RDI->mem_root + 0x90))();
        bVar7 = (bool)(bVar1 & 1);
      }
      else {
        bVar7 = false;
      }
    }
  }
LAB_0010ac32:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool QMYSQLResult::fetch(int i)
{
    Q_D(QMYSQLResult);
    if (!driver())
        return false;
    if (isForwardOnly()) { // fake a forward seek
        if (at() < i) {
            int x = i - at();
            while (--x && fetchNext()) {};
            return fetchNext();
        } else {
            return false;
        }
    }
    if (at() == i)
        return true;
    if (d->preparedQuery) {
        mysql_stmt_data_seek(d->stmt, i);

        int nRC = mysql_stmt_fetch(d->stmt);
        if (nRC) {
            if (nRC == 1 || nRC == MYSQL_DATA_TRUNCATED)
                setLastError(qMakeStmtError(QCoreApplication::translate("QMYSQLResult",
                         "Unable to fetch data"), QSqlError::StatementError, d->stmt));
            return false;
        }
    } else {
        mysql_data_seek(d->result, i);
        d->row = mysql_fetch_row(d->result);
        if (!d->row)
            return false;
    }

    setAt(i);
    return true;
}